

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  char cVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  bool bVar5;
  ImGuiID id;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  int order_n;
  ulong uVar8;
  int i;
  ImSpan<signed_char> *this;
  uint uVar9;
  float fVar10;
  bool hovered;
  bool held;
  float local_74;
  ImSpan<signed_char> *local_70;
  ImRect hit_rect;
  float local_48;
  
  pIVar3 = GImGui;
  if ((table->Flags & 1) == 0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x221f,"TableUpdateBorders","ImGui ASSERT FAILED: %s",
                "table->Flags & ImGuiTableFlags_Resizable");
  }
  if (table->IsUsingHeaders == false) {
    bVar4 = 1;
  }
  else {
    bVar4 = (*(byte *)((long)&table->Flags + 1) & 8) >> 3;
  }
  local_74 = (table->OuterRect).Min.y;
  if (bVar4 == 0) {
    local_48 = table->LastFirstRowHeight + local_74;
  }
  else {
    fVar1 = (table->OuterRect).Max.y;
    fVar10 = table->LastOuterHeight + local_74;
    uVar9 = -(uint)(fVar10 <= fVar1);
    local_48 = (float)(uVar9 & (uint)fVar1 | ~uVar9 & (uint)fVar10);
  }
  this = &table->DisplayOrderToIndex;
  uVar8 = 0;
  local_70 = this;
  do {
    if ((long)table->ColumnsCount <= (long)uVar8) {
      return;
    }
    if ((table->VisibleMaskByDisplayOrder >> (uVar8 & 0x3f) & 1) != 0) {
      pcVar6 = ImSpan<signed_char>::operator[](this,(int)uVar8);
      cVar2 = *pcVar6;
      i = (int)cVar2;
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
      if ((pIVar7->Flags & 0x100020U) == 0) {
        id = TableGetColumnResizeID(table,i,(int)table->InstanceCurrent);
        hit_rect.Min.x = pIVar7->MaxX + -4.0;
        hit_rect.Max.x = pIVar7->MaxX + 4.0;
        hit_rect.Min.y = local_74;
        hit_rect.Max.y = local_48;
        KeepAliveID(id);
        hovered = false;
        held = false;
        bVar5 = ButtonBehavior(&hit_rect,id,&hovered,&held,0x1a2);
        if (((bVar5) && (bVar5 = IsMouseDoubleClicked(0), bVar5)) && ((pIVar7->Flags & 8) == 0)) {
          TableSetColumnAutofit(table,i);
          ClearActiveID();
          hovered = false;
          held = false;
        }
        this = local_70;
        if (held == true) {
          table->ResizedColumn = cVar2;
          table->InstanceInteracted = table->InstanceCurrent;
          if (hovered != false) {
LAB_001c6990:
            if ((pIVar3->HoveredIdTimer <= 0.06 & (held ^ 1U)) != 0) goto LAB_001c69bc;
          }
          table->HoveredColumnBorder = cVar2;
          SetMouseCursor(4);
        }
        else if (hovered == true) goto LAB_001c6990;
      }
    }
LAB_001c69bc:
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void    ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    const bool borders_full_height = (table->IsUsingHeaders == false) || (table->Flags & ImGuiTableFlags_BordersFullHeightV);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_full = ImMax(table->OuterRect.Max.y, hit_y1 + table->LastOuterHeight);
    const float hit_y2 = borders_full_height ? hit_y2_full : (hit_y1 + table->LastFirstRowHeight);

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, hit_y2);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick);
        if (pressed && IsMouseDoubleClicked(0) && !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
        {
            // FIXME-TABLE: Double-clicking on column edge could auto-fit Stretch column?
            TableSetColumnAutofit(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            table->ResizedColumn = (ImS8)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImS8)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}